

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.cpp
# Opt level: O1

void __thiscall Iir::RBJ::HighPass::setupN(HighPass *this,double cutoffFrequency,double q)

{
  double dVar1;
  double dVar2;
  double b0;
  
  dVar1 = cos(cutoffFrequency * 6.283185307179586);
  dVar2 = sin(cutoffFrequency * 6.283185307179586);
  dVar2 = dVar2 / (q + q);
  b0 = (dVar1 + 1.0) * 0.5;
  Biquad::setCoefficients((Biquad *)this,dVar2 + 1.0,dVar1 * -2.0,1.0 - dVar2,b0,-(dVar1 + 1.0),b0);
  return;
}

Assistant:

void HighPass::setupN (double cutoffFrequency,
			      double q)
	{
		double w0 = 2 * doublePi * cutoffFrequency;
		double cs = cos (w0);
		double sn = sin (w0);
		double AL = sn / ( 2 * q );
		double b0 =  (1 + cs) / 2;
		double b1 = -(1 + cs);
		double b2 =  (1 + cs) / 2;
		double a0 =  1 + AL;
		double a1 = -2 * cs;
		double a2 =  1 - AL;
		setCoefficients (a0, a1, a2, b0, b1, b2);
	}